

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O0

bool __thiscall
ON_Line::GetTightBoundingBox(ON_Line *this,ON_BoundingBox *tight_bbox,bool bGrowBox,ON_Xform *xform)

{
  bool bVar1;
  ON_3dPoint local_58;
  undefined1 local_40 [8];
  ON_3dPoint P;
  ON_Xform *xform_local;
  bool bGrowBox_local;
  ON_BoundingBox *tight_bbox_local;
  ON_Line *this_local;
  
  P.z = (double)xform;
  xform_local._7_1_ = bGrowBox;
  if ((bGrowBox) && (bVar1 = ON_BoundingBox::IsValid(tight_bbox), !bVar1)) {
    xform_local._7_1_ = 0;
  }
  if ((P.z != 0.0) && (bVar1 = ON_Xform::IsIdentity((ON_Xform *)P.z,0.0), !bVar1)) {
    ON_Xform::operator*((ON_3dPoint *)local_40,(ON_Xform *)P.z,&this->from);
    ON_BoundingBox::Set(tight_bbox,(ON_3dPoint *)local_40,(uint)(xform_local._7_1_ & 1));
    ON_Xform::operator*(&local_58,(ON_Xform *)P.z,&this->to);
    local_40 = (undefined1  [8])local_58.x;
    P.x = local_58.y;
    P.y = local_58.z;
    ON_BoundingBox::Set(tight_bbox,(ON_3dPoint *)local_40,1);
    return true;
  }
  ON_BoundingBox::Set(tight_bbox,&this->from,(uint)(xform_local._7_1_ & 1));
  ON_BoundingBox::Set(tight_bbox,&this->to,1);
  return true;
}

Assistant:

bool ON_Line::GetTightBoundingBox( 
		ON_BoundingBox& tight_bbox, 
    bool bGrowBox,
		const ON_Xform* xform
    ) const
{
  if ( bGrowBox && !tight_bbox.IsValid() )
  {
    bGrowBox = false;
  }

  if ( xform && !xform->IsIdentity() )
  {
    ON_3dPoint P = (*xform)*from;
    tight_bbox.Set(P,bGrowBox);
    bGrowBox = true;
    P = (*xform)*to;
    tight_bbox.Set(P,bGrowBox);
  }
  else
  {
    tight_bbox.Set(from,bGrowBox);
    bGrowBox = true;
    tight_bbox.Set(to,bGrowBox);
  }

  return (0!=bGrowBox);
}